

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> *
split<unsigned_short>
          (string *s,char delim,
          function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *transform)

{
  undefined1 uVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char in_DL;
  string *in_RSI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDI;
  string item;
  stringstream ss;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *elems;
  value_type_conflict1 *in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined7 in_stack_fffffffffffffdd0;
  string local_208 [38];
  unsigned_short local_1e2;
  string local_1e0 [48];
  stringstream local_1b0 [399];
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  char local_11;
  string *local_10;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x13ce42);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b0,local_10,_Var2);
  std::__cxx11::string::string(local_1e0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,local_1e0,local_11);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!(bool)uVar1) break;
    __args = local_20;
    std::__cxx11::string::string(local_208,local_1e0);
    local_1e2 = std::
                function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                ::operator()((function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)CONCAT17(uVar1,in_stack_fffffffffffffdd0),__args);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT26(local_1e2,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_208);
  }
  local_21 = 1;
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  if ((local_21 & 1) == 0) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffdd0));
  }
  return in_RDI;
}

Assistant:

std::vector<t> split(const std::string& s, char delim, const std::function<t(std::string)>& transform) {
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)) elems.push_back(transform(item));
	return elems;
}